

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe_withSmallPrefix
              (char *source,char *dest,int compressedSize,int maxOutputSize,size_t prefixSize)

{
  ushort *puVar1;
  BYTE *pBVar2;
  byte *pbVar3;
  byte bVar4;
  BYTE BVar5;
  undefined8 uVar6;
  ushort uVar7;
  ushort uVar8;
  U32 length;
  uint uVar9;
  int iVar10;
  ushort *puVar11;
  ulong uVar12;
  ushort *puVar13;
  BYTE *pBVar14;
  char cVar15;
  uint uVar16;
  ushort *puVar17;
  ulong uVar18;
  BYTE *pBVar19;
  long lVar20;
  BYTE *pBVar21;
  BYTE *pBVar22;
  BYTE *pBVar23;
  BYTE *pBVar24;
  BYTE *unaff_R12;
  BYTE *d;
  BYTE *pBVar25;
  BYTE *s;
  ushort *puVar26;
  ulong uStack_80;
  int local_68;
  
  puVar11 = (ushort *)0xffffffffffffffff;
  if (source != (char *)0x0) {
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        puVar11 = (ushort *)(ulong)-(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      pBVar25 = (BYTE *)(dest + -prefixSize);
      puVar1 = (ushort *)(source + compressedSize);
      pBVar2 = (BYTE *)(dest + maxOutputSize);
      pBVar22 = (BYTE *)dest;
      puVar11 = (ushort *)source;
      if (maxOutputSize < 0x40) goto LAB_0010437e;
      puVar17 = (ushort *)((long)puVar1 - 0xf);
      puVar13 = (ushort *)source;
LAB_00103ef0:
      bVar4 = (byte)*puVar13;
      uVar9 = (uint)bVar4;
      puVar26 = (ushort *)((long)puVar13 + 1);
      uVar18 = (ulong)(uint)(bVar4 >> 4);
      puVar11 = puVar26;
      if (bVar4 >> 4 == 0xf) {
        uVar18 = 0xf;
        if (puVar26 < puVar17) {
          uVar16 = 0;
          do {
            uVar7 = *puVar11;
            puVar11 = (ushort *)((long)puVar11 + 1);
            uVar16 = uVar16 + (byte)uVar7;
          } while (puVar11 < puVar17 && (byte)uVar7 == 0xff);
          uVar18 = (ulong)uVar16 + 0xf;
        }
        pBVar21 = pBVar22 + uVar18;
        if (((puVar17 <= puVar26) || (CARRY8((ulong)pBVar22,uVar18))) ||
           (CARRY8((ulong)puVar11,uVar18))) {
          iVar10 = 5;
          pBVar21 = pBVar22;
        }
        else {
          unaff_R12 = pBVar21;
          if ((pBVar2 + -0x20 < pBVar21) || (puVar1 + -0x10 < (ushort *)((long)puVar11 + uVar18))) {
            iVar10 = 6;
            pBVar21 = pBVar22;
          }
          else {
            lVar20 = 0;
            do {
              uVar6 = *(undefined8 *)((byte *)((long)puVar11 + lVar20) + 8);
              pBVar19 = pBVar22 + lVar20;
              *(undefined8 *)pBVar19 = *(undefined8 *)((long)puVar11 + lVar20);
              *(undefined8 *)(pBVar19 + 8) = uVar6;
              pbVar3 = (byte *)((long)puVar11 + lVar20 + 0x10);
              uVar6 = *(undefined8 *)(pbVar3 + 8);
              *(undefined8 *)(pBVar19 + 0x10) = *(undefined8 *)pbVar3;
              *(undefined8 *)(pBVar19 + 0x18) = uVar6;
              lVar20 = lVar20 + 0x20;
            } while (pBVar19 + 0x20 < pBVar21);
            iVar10 = 0;
            puVar11 = (ushort *)((long)puVar11 + uVar18);
          }
        }
        if (iVar10 != 0) {
          if (iVar10 != 5) {
            pBVar22 = pBVar21;
            if (iVar10 == 6) goto LAB_00104275;
            goto LAB_0010443d;
          }
          goto LAB_00104435;
        }
      }
      else {
        pBVar21 = pBVar22 + uVar18;
        unaff_R12 = pBVar21;
        if ((ushort *)((long)puVar1 - 0x11U) < puVar26) goto LAB_00104275;
        uVar6 = *(undefined8 *)((long)puVar13 + 9);
        *(undefined8 *)pBVar22 = *(undefined8 *)puVar26;
        *(undefined8 *)(pBVar22 + 8) = uVar6;
        puVar11 = (ushort *)(uVar18 + (long)puVar26);
      }
      uVar7 = *puVar11;
      uVar12 = (ulong)uVar7;
      puVar11 = puVar11 + 1;
      pBVar19 = pBVar21 + -uVar12;
      uVar18 = (ulong)(bVar4 & 0xf);
      if (uVar18 == 0xf) {
        if (pBVar19 < pBVar25) {
          iVar10 = 5;
          uStack_80 = 0xf;
        }
        else {
          uVar9 = 0;
          do {
            uVar8 = *puVar11;
            puVar11 = (ushort *)((long)puVar11 + 1);
            uVar9 = uVar9 + (byte)uVar8;
          } while ((byte)uVar8 == 0xff && puVar11 < puVar1 + -2);
          uVar18 = (ulong)uVar9;
          uStack_80 = uVar18 + 0xf;
          if ((puVar1 + -2 <= puVar11) || (CARRY8((ulong)pBVar21,uStack_80))) {
            iVar10 = 5;
          }
          else {
            uStack_80 = uVar18 + 0x13;
            iVar10 = 7;
            if (pBVar21 + uVar18 + 0x13 < pBVar2 + -0x40) {
              iVar10 = 0;
            }
          }
        }
        if (iVar10 != 0) {
          if (iVar10 != 5) {
            if (iVar10 != 7) goto LAB_0010443d;
            goto LAB_00104320;
          }
          goto LAB_00104435;
        }
LAB_00104081:
        if (pBVar19 < pBVar25) goto LAB_00104435;
        unaff_R12 = pBVar21 + uStack_80;
        pBVar22 = unaff_R12;
        puVar13 = puVar11;
        if (uVar7 < 0x10) {
          LZ4_memcpy_using_offset(pBVar21,pBVar19,unaff_R12,uVar12);
        }
        else {
          do {
            uVar6 = *(undefined8 *)(pBVar21 + -uVar12 + 8);
            *(undefined8 *)pBVar21 = *(undefined8 *)(pBVar21 + -uVar12);
            *(undefined8 *)(pBVar21 + 8) = uVar6;
            uVar6 = *(undefined8 *)(pBVar21 + -uVar12 + 0x10 + 8);
            *(undefined8 *)(pBVar21 + 0x10) = *(undefined8 *)(pBVar21 + -uVar12 + 0x10);
            *(undefined8 *)(pBVar21 + 0x18) = uVar6;
            pBVar21 = pBVar21 + 0x20;
          } while (pBVar21 < unaff_R12);
        }
      }
      else {
        uStack_80 = uVar18 + 4;
        if (pBVar2 + -0x40 <= pBVar21 + uVar18 + 4) goto LAB_00104320;
        if ((pBVar19 < pBVar25) || (uVar7 < 8)) goto LAB_00104081;
        *(undefined8 *)pBVar21 = *(undefined8 *)pBVar19;
        *(undefined8 *)(pBVar21 + 8) = *(undefined8 *)(pBVar19 + 8);
        *(undefined2 *)(pBVar21 + 0x10) = *(undefined2 *)(pBVar19 + 0x10);
        pBVar22 = pBVar21 + uVar18 + 4;
        puVar13 = puVar11;
      }
      goto LAB_00103ef0;
    }
  }
LAB_0010443d:
  return (int)puVar11;
LAB_00104320:
  if (pBVar19 < pBVar25) goto LAB_00104435;
  pBVar22 = pBVar21 + uStack_80;
  if ((uint)uVar12 < 8) {
    pBVar21[0] = '\0';
    pBVar21[1] = '\0';
    pBVar21[2] = '\0';
    pBVar21[3] = '\0';
    *pBVar21 = *pBVar19;
    pBVar21[1] = pBVar19[1];
    pBVar21[2] = pBVar19[2];
    pBVar21[3] = pBVar19[3];
    uVar18 = (ulong)((uint)uVar12 << 2);
    uVar12 = (ulong)*(uint *)((long)inc32table + uVar18);
    *(undefined4 *)(pBVar21 + 4) = *(undefined4 *)(pBVar19 + uVar12);
    pBVar19 = pBVar19 + (uVar12 - (long)*(int *)((long)dec64table + uVar18));
  }
  else {
    *(undefined8 *)pBVar21 = *(undefined8 *)pBVar19;
    pBVar19 = pBVar19 + 8;
  }
  pBVar14 = pBVar21 + 8;
  if (pBVar2 + -0xc < pBVar22) {
    iVar10 = 5;
    if (pBVar22 <= pBVar2 + -5) {
      pBVar21 = pBVar2 + -7;
      pBVar23 = pBVar19;
      pBVar24 = pBVar14;
      if (pBVar14 < pBVar21) {
        do {
          *(undefined8 *)pBVar24 = *(undefined8 *)pBVar23;
          pBVar24 = pBVar24 + 8;
          pBVar23 = pBVar23 + 8;
        } while (pBVar24 < pBVar21);
        pBVar19 = pBVar19 + ((long)pBVar21 - (long)pBVar14);
        pBVar14 = pBVar21;
      }
      iVar10 = 0;
      for (; pBVar14 < pBVar22; pBVar14 = pBVar14 + 1) {
        BVar5 = *pBVar19;
        pBVar19 = pBVar19 + 1;
        *pBVar14 = BVar5;
      }
    }
    if (iVar10 != 0) {
      if (iVar10 != 5) goto LAB_0010443d;
      goto LAB_00104435;
    }
  }
  else {
    *(undefined8 *)pBVar14 = *(undefined8 *)pBVar19;
    if (0x10 < uStack_80) {
      pBVar21 = pBVar21 + 0x10;
      do {
        pBVar19 = pBVar19 + 8;
        *(undefined8 *)pBVar21 = *(undefined8 *)pBVar19;
        pBVar21 = pBVar21 + 8;
      } while (pBVar21 < pBVar22);
    }
  }
LAB_0010437e:
  bVar4 = (byte)*puVar11;
  puVar17 = (ushort *)((long)puVar11 + 1);
  while( true ) {
    uVar9 = (uint)bVar4;
    if (bVar4 >> 4 == 0xf) break;
    uVar18 = (ulong)(uint)(bVar4 >> 4);
    if ((source + (long)compressedSize + -0x10 <= puVar17) ||
       (dest + (long)maxOutputSize + -0x20 < pBVar22)) goto LAB_0010426f;
    uVar6 = *(undefined8 *)(puVar17 + 4);
    *(undefined8 *)pBVar22 = *(undefined8 *)puVar17;
    *(undefined8 *)(pBVar22 + 8) = uVar6;
    unaff_R12 = pBVar22 + uVar18;
    uStack_80 = (ulong)(uVar9 & 0xf);
    puVar11 = (ushort *)((long)puVar17 + uVar18) + 1;
    uVar7 = *(ushort *)((long)puVar17 + uVar18);
    uVar12 = (ulong)uVar7;
    pBVar19 = unaff_R12 + -uVar12;
    if ((((uVar9 & 0xf) == 0xf) || (uVar7 < 8)) || (pBVar19 < pBVar25)) goto LAB_001042bf;
    *(undefined8 *)unaff_R12 = *(undefined8 *)pBVar19;
    *(undefined8 *)(unaff_R12 + 8) = *(undefined8 *)(pBVar19 + 8);
    *(undefined2 *)(unaff_R12 + 0x10) = *(undefined2 *)(pBVar19 + 0x10);
    pBVar22 = unaff_R12 + uStack_80 + 4;
    bVar4 = *(byte *)((long)puVar17 + uVar18 + 2);
    puVar17 = (ushort *)((long)puVar17 + uVar18 + 3);
  }
  puVar13 = (ushort *)((long)puVar1 - 0xf);
  uVar18 = 0xf;
  puVar11 = puVar17;
  if (puVar17 < puVar13) {
    uVar16 = 0;
    do {
      uVar7 = *puVar11;
      puVar11 = (ushort *)((long)puVar11 + 1);
      uVar16 = uVar16 + (byte)uVar7;
    } while (puVar11 < puVar13 && (byte)uVar7 == 0xff);
    uVar18 = (ulong)uVar16 + 0xf;
  }
  if (((puVar13 <= puVar17) || (CARRY8((ulong)pBVar22,uVar18))) ||
     (puVar17 = puVar11, CARRY8((ulong)puVar11,uVar18))) goto LAB_00104435;
LAB_0010426f:
  unaff_R12 = pBVar22 + uVar18;
  puVar11 = puVar17;
LAB_00104275:
  puVar17 = (ushort *)((long)puVar11 + uVar18);
  if ((pBVar2 + -0xc < unaff_R12) || (puVar1 + -4 < puVar17)) {
    if ((puVar17 == puVar1) && (unaff_R12 <= pBVar2)) {
      memmove(pBVar22,puVar11,uVar18);
      puVar11 = (ushort *)(ulong)(uint)(((int)pBVar22 + (int)uVar18) - (int)dest);
      goto LAB_0010443d;
    }
    goto LAB_00104435;
  }
  do {
    *(undefined8 *)pBVar22 = *(undefined8 *)puVar11;
    pBVar22 = pBVar22 + 8;
    puVar11 = puVar11 + 4;
  } while (pBVar22 < unaff_R12);
  uVar12 = (ulong)*puVar17;
  puVar11 = puVar17 + 1;
  pBVar19 = unaff_R12 + -uVar12;
  uStack_80 = (ulong)(uVar9 & 0xf);
LAB_001042bf:
  if ((int)uStack_80 == 0xf) {
    uVar9 = 0;
    do {
      uVar7 = *puVar11;
      puVar11 = (ushort *)((long)puVar11 + 1);
      uVar9 = uVar9 + (byte)uVar7;
    } while (puVar11 < puVar1 + -2 && (byte)uVar7 == 0xff);
    uStack_80 = (ulong)uVar9 + 0xf;
    cVar15 = '\x05';
    if (puVar11 < puVar1 + -2) {
      cVar15 = CARRY8((ulong)unaff_R12,uStack_80) * '\x05';
    }
    if (cVar15 != '\0') {
      if (cVar15 != '\x05') goto LAB_0010443d;
      goto LAB_00104435;
    }
  }
  uStack_80 = uStack_80 + 4;
  pBVar21 = unaff_R12;
  goto LAB_00104320;
LAB_00104435:
  local_68 = (int)source;
  puVar11 = (ushort *)(ulong)(~(uint)puVar11 + local_68);
  goto LAB_0010443d;
}

Assistant:

LZ4_FORCE_O2_GCC_PPC64LE
static int LZ4_decompress_safe_withSmallPrefix(const char* source, char* dest, int compressedSize, int maxOutputSize,
                                               size_t prefixSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  endOnInputSize, decode_full_block, noDict,
                                  (BYTE*)dest-prefixSize, NULL, 0);
}